

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

LY_ERR lys_set_implemented(lys_module *mod,char **features)

{
  lys_glob_unres *unres_00;
  lys_glob_unres *unres;
  LY_ERR ret;
  char **features_local;
  lys_module *mod_local;
  
  unres_00 = &mod->ctx->unres;
  if (mod == (lys_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","mod",
           "lys_set_implemented");
    mod_local._4_4_ = LY_EINVAL;
  }
  else if (mod->parsed == (lysp_module *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","mod->parsed",
           "lys_set_implemented");
    mod_local._4_4_ = LY_EINVAL;
  }
  else {
    unres._4_4_ = _lys_set_implemented(mod,features,unres_00);
    if ((((unres._4_4_ == LY_SUCCESS) && ((mod->ctx->flags & 0x80) == 0)) &&
        (unres._4_4_ = lys_unres_dep_sets_create(mod->ctx,&unres_00->dep_sets,mod),
        unres._4_4_ == LY_SUCCESS)) &&
       (unres._4_4_ = lys_compile_depset_all(mod->ctx,unres_00), unres._4_4_ == LY_SUCCESS)) {
      lys_unres_glob_erase(unres_00);
    }
    if (unres._4_4_ != LY_SUCCESS) {
      lys_unres_glob_revert(mod->ctx,unres_00);
      lys_unres_glob_erase(unres_00);
    }
    mod_local._4_4_ = unres._4_4_;
  }
  return mod_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_set_implemented(struct lys_module *mod, const char **features)
{
    LY_ERR ret = LY_SUCCESS;
    struct lys_glob_unres *unres = &mod->ctx->unres;

    LY_CHECK_ARG_RET(NULL, mod, mod->parsed, LY_EINVAL);

    /* implement */
    ret = _lys_set_implemented(mod, features, unres);
    LY_CHECK_GOTO(ret, cleanup);

    if (!(mod->ctx->flags & LY_CTX_EXPLICIT_COMPILE)) {
        /* create dep set for the module and mark all the modules that will be (re)compiled */
        LY_CHECK_GOTO(ret = lys_unres_dep_sets_create(mod->ctx, &unres->dep_sets, mod), cleanup);

        /* (re)compile the whole dep set (other dep sets will have no modules marked for compilation) */
        LY_CHECK_GOTO(ret = lys_compile_depset_all(mod->ctx, unres), cleanup);

        /* unres resolved */
        lys_unres_glob_erase(unres);
    }

cleanup:
    if (ret) {
        lys_unres_glob_revert(mod->ctx, unres);
        lys_unres_glob_erase(unres);
    }
    return ret;
}